

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *this_00;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  LogMessage *in_stack_ffffffffffffff80;
  LogMessage *in_stack_ffffffffffffff90;
  string local_60 [64];
  MessageLite *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  internal::LogMessage::LogMessage
            (in_stack_ffffffffffffff90,(LogLevel)((ulong)in_RDI >> 0x20),
             (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  this_00 = internal::LogMessage::operator<<
                      (in_stack_ffffffffffffff80,
                       (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  internal::LogFinisher::operator=
            ((LogFinisher *)this_00,
             (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::__cxx11::string::~string(local_60);
  internal::LogMessage::~LogMessage((LogMessage *)0x4173ea);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  GOOGLE_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}